

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlCharEncError UTF8ToUTF16LE(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  xmlCharEncError xVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar5 = (int)out;
  iVar6 = (int)in;
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || out == (uchar *)0x0)) {
    return XML_ENC_ERR_INTERNAL;
  }
  if (in == (uchar *)0x0) {
    *outlen = 0;
    iVar6 = 0;
    xVar1 = XML_ENC_ERR_SUCCESS;
  }
  else {
    pbVar7 = in + *inlen;
    pbVar8 = out + ((long)*outlen & 0xfffffffffffffffe);
    xVar1 = XML_ENC_ERR_INPUT;
    while (in < pbVar7) {
      bVar2 = *in;
      if ((char)bVar2 < '\0') {
        if (bVar2 < 0xe0) {
          if (bVar2 < 0xc2) goto LAB_0012a937;
          uVar3 = bVar2 & 0x1f;
          uVar4 = 0x80;
          lVar9 = 2;
        }
        else {
          lVar9 = 4 - (ulong)(bVar2 < 0xf0);
          uVar4 = 0x10000;
          if (bVar2 < 0xf0) {
            uVar4 = 0x800;
          }
          uVar3 = bVar2 & 0xf;
        }
        if ((long)pbVar7 - (long)in < lVar9) break;
        for (lVar10 = 1; lVar9 != lVar10; lVar10 = lVar10 + 1) {
          if ((in[lVar10] & 0xc0) != 0x80) goto LAB_0012a937;
          uVar3 = uVar3 << 6 | in[lVar10] & 0x3f;
        }
        if (((uVar3 < uVar4) || (0x10ffff < uVar3)) || ((uVar3 & 0xfffff800) == 0xd800))
        goto LAB_0012a937;
        bVar2 = (byte)(uVar3 >> 8);
        if (0xffff < uVar3) {
          if (3 < (long)pbVar8 - (long)out) {
            *out = (byte)(uVar3 - 0x10000 >> 10);
            out[1] = (byte)(uVar3 - 0x10000 >> 0x12) | 0xd8;
            out[2] = (byte)uVar3;
            bVar2 = bVar2 & 3 | 0xdc;
            lVar11 = 3;
            lVar10 = 4;
            goto LAB_0012a913;
          }
          goto LAB_0012a932;
        }
        if (pbVar8 <= out) goto LAB_0012a932;
        *out = (byte)uVar3;
        lVar11 = 1;
        lVar10 = 2;
LAB_0012a913:
        out[lVar11] = bVar2;
        out = out + lVar10;
        in = in + lVar9;
      }
      else {
        if (pbVar8 <= out) {
LAB_0012a932:
          xVar1 = XML_ENC_ERR_SPACE;
          goto LAB_0012a937;
        }
        *out = bVar2;
        out[1] = 0;
        in = in + 1;
        out = out + 2;
      }
    }
    xVar1 = (int)out - iVar5;
LAB_0012a937:
    *outlen = (int)out - iVar5;
    iVar6 = (int)in - iVar6;
  }
  *inlen = iVar6;
  return xVar1;
}

Assistant:

static xmlCharEncError
UTF8ToUTF16LE(void *vctxt ATTRIBUTE_UNUSED,
              unsigned char *out, int *outlen,
              const unsigned char *in, int *inlen,
              int flush ATTRIBUTE_UNUSED) {
    const unsigned char *instart = in;
    const unsigned char *inend;
    unsigned char *outstart = out;
    unsigned char *outend;
    unsigned c, d;
    int ret = XML_ENC_ERR_SPACE;

    /* UTF16LE encoding has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend = in + *inlen;
    outend = out + (*outlen & ~1);
    while (in < inend) {
        c = in[0];

        if (c < 0x80) {
            if (out >= outend)
                goto done;
            out[0] = c;
            out[1] = 0;
            in += 1;
            out += 2;
        } else {
            int i, len;
            unsigned min;

            if (c < 0xE0) {
                if (c < 0xC2) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c &= 0x1F;
                len = 2;
                min = 0x80;
            } else if (c < 0xF0) {
                c &= 0x0F;
                len = 3;
                min = 0x800;
            } else {
                c &= 0x0F;
                len = 4;
                min = 0x10000;
            }

            if (inend - in < len)
                break;

            for (i = 1; i < len; i++) {
                if ((in[i] & 0xC0) != 0x80) {
                    ret = XML_ENC_ERR_INPUT;
                    goto done;
                }
                c = (c << 6) | (in[i] & 0x3F);
            }

            if ((c < min) ||
                ((c >= 0xD800) && (c <= 0xDFFF)) ||
                (c > 0x10FFFF)) {
                ret = XML_ENC_ERR_INPUT;
                goto done;
            }

            if (c < 0x10000) {
                if (out >= outend)
                    goto done;
                out[0] = c & 0xFF;
                out[1] = c >> 8;
                out += 2;
            } else {
                if (outend - out < 4)
                    goto done;
                c -= 0x10000;
                d = (c & 0x03FF) | 0xDC00;
                c = (c >> 10)    | 0xD800;
                out[0] = c & 0xFF;
                out[1] = c >> 8;
                out[2] = d & 0xFF;
                out[3] = d >> 8;
                out += 4;
            }

            in += len;
        }
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}